

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

void TTD::NSLogEvents::JsRTCallFunctionAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  int32 iVar1;
  uint32 uVar2;
  JsRTCallFunctionAction *pJVar3;
  TTDVar pvVar4;
  void **ppvVar5;
  FileReader *reader_00;
  int64 iVar6;
  JsRTCallFunctionAction_ReplayAdditionalInfo *pJVar7;
  FileReader *reader_01;
  FileReader *extraout_RDX;
  Var *local_40;
  uint local_34;
  uint32 i;
  JsRTCallFunctionAction *cfAction;
  UnlinkableSlabAllocator *alloc_local;
  FileReader *reader_local;
  ThreadContext *threadContext_local;
  EventLogEntry *evt_local;
  
  pJVar3 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  pvVar4 = NSSnapValues::ParseTTDVar((NSSnapValues *)0x0,SUB81(reader,0),reader_01);
  pJVar3->Result = pvVar4;
  iVar1 = FileReader::ReadInt32(reader,rootNestingDepth,true);
  pJVar3->CallbackDepth = iVar1;
  uVar2 = FileReader::ReadLengthValue(reader,true);
  pJVar3->ArgCount = uVar2;
  ppvVar5 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)pJVar3->ArgCount);
  pJVar3->ArgArray = ppvVar5;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  reader_00 = extraout_RDX;
  for (local_34 = 0; local_34 < pJVar3->ArgCount; local_34 = local_34 + 1) {
    reader_00 = (FileReader *)
                NSSnapValues::ParseTTDVar
                          ((NSSnapValues *)(ulong)(local_34 != 0),SUB81(reader,0),reader_00);
    pJVar3->ArgArray[local_34] = reader_00;
  }
  (*reader->_vptr_FileReader[5])();
  iVar6 = FileReader::ReadInt64(reader,eventTime,true);
  pJVar3->CallEventTime = iVar6;
  iVar6 = FileReader::ReadInt64(reader,eventTime,true);
  pJVar3->TopLevelCallbackEventTime = iVar6;
  pJVar7 = SlabAllocatorBase<8>::
           SlabAllocateStruct<TTD::NSLogEvents::JsRTCallFunctionAction_ReplayAdditionalInfo>(alloc);
  pJVar3->AdditionalReplayInfo = pJVar7;
  pJVar3->AdditionalReplayInfo->RtRSnap = (SnapShot *)0x0;
  if (pJVar3->ArgCount < 2) {
    local_40 = (Var *)0x0;
  }
  else {
    local_40 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(pJVar3->ArgCount - 1));
  }
  pJVar3->AdditionalReplayInfo->ExecArgs = local_40;
  TTDebuggerSourceLocation::Initialize(&pJVar3->AdditionalReplayInfo->LastExecutedLocation);
  iVar6 = FileReader::ReadInt64(reader,i64Val,true);
  pJVar3->LastNestedEvent = iVar6;
  FileReader::ReadString<TTD::SlabAllocatorBase<8>>(reader,name,alloc,&pJVar3->FunctionName,true);
  return;
}

Assistant:

void JsRTCallFunctionAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            cfAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            cfAction->CallbackDepth = reader->ReadInt32(NSTokens::Key::rootNestingDepth, true);

            cfAction->ArgCount = reader->ReadLengthValue(true);
            cfAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(cfAction->ArgCount);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < cfAction->ArgCount; ++i)
            {
                cfAction->ArgArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }
            reader->ReadSequenceEnd();

            cfAction->CallEventTime = reader->ReadInt64(NSTokens::Key::eventTime, true);

            cfAction->TopLevelCallbackEventTime = reader->ReadInt64(NSTokens::Key::eventTime, true);

            cfAction->AdditionalReplayInfo = alloc.SlabAllocateStruct<JsRTCallFunctionAction_ReplayAdditionalInfo>();

            cfAction->AdditionalReplayInfo->RtRSnap = nullptr;
            cfAction->AdditionalReplayInfo->ExecArgs = (cfAction->ArgCount > 1) ? alloc.SlabAllocateArray<Js::Var>(cfAction->ArgCount - 1) : nullptr; //ArgCount includes slot for function which we don't use in exec

            cfAction->AdditionalReplayInfo->LastExecutedLocation.Initialize();

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            cfAction->LastNestedEvent = reader->ReadInt64(NSTokens::Key::i64Val, true);
            reader->ReadString(NSTokens::Key::name, alloc, cfAction->FunctionName, true);
#endif
        }